

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_all.cc
# Opt level: O0

int i2d_PKCS8_PRIV_KEY_INFO_bio(BIO *bp,PKCS8_PRIV_KEY_INFO *p8inf)

{
  int iVar1;
  int ret;
  int len;
  uint8_t *data;
  PKCS8_PRIV_KEY_INFO *obj_local;
  BIO *bio_local;
  
  _ret = (uchar *)0x0;
  data = (uint8_t *)p8inf;
  obj_local = (PKCS8_PRIV_KEY_INFO *)bp;
  iVar1 = i2d_PKCS8_PRIV_KEY_INFO(p8inf,(uchar **)&ret);
  if (iVar1 < 0) {
    bio_local._4_4_ = 0;
  }
  else {
    iVar1 = BIO_write_all((BIO *)obj_local,_ret,(long)iVar1);
    OPENSSL_free(_ret);
    bio_local._4_4_ = iVar1;
  }
  return bio_local._4_4_;
}

Assistant:

int i2d_PKCS8PrivateKeyInfo_bio(BIO *bp, EVP_PKEY *key) {
  PKCS8_PRIV_KEY_INFO *p8inf;
  int ret;
  p8inf = EVP_PKEY2PKCS8(key);
  if (!p8inf) {
    return 0;
  }
  ret = i2d_PKCS8_PRIV_KEY_INFO_bio(bp, p8inf);
  PKCS8_PRIV_KEY_INFO_free(p8inf);
  return ret;
}